

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  tm *ptVar1;
  int value;
  int value_00;
  int value_01;
  int value_02;
  int value_03;
  string local_238;
  undefined1 local_218 [8];
  tm time_struct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  
  local_40._M_dataplus._M_p = (pointer)((long)this / 1000);
  ptVar1 = localtime_r((time_t *)&local_40,(tm *)local_218);
  if (ptVar1 == (tm *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_40);
  }
  else {
    local_1c = time_struct.tm_mday + 0x76c;
    StreamableToString<int>(&local_238,&local_1c);
    std::operator+(&local_100,&local_238,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_e0,(String *)(ulong)(time_struct.tm_hour + 1),value);
    std::operator+(&local_120,&local_100,&local_e0);
    std::operator+(&local_140,&local_120,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_c0,(String *)(ulong)(uint)time_struct.tm_min,value_00)
    ;
    std::operator+(&local_160,&local_140,&local_c0);
    std::operator+(&local_180,&local_160,"T");
    String::FormatIntWidth2_abi_cxx11_(&local_a0,(String *)(ulong)(uint)time_struct.tm_sec,value_01)
    ;
    std::operator+(&local_1a0,&local_180,&local_a0);
    std::operator+(&local_1c0,&local_1a0,":");
    String::FormatIntWidth2_abi_cxx11_(&local_80,(String *)(ulong)(uint)local_218._4_4_,value_02);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &time_struct.tm_zone,&local_1c0,&local_80);
    std::operator+(&local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &time_struct.tm_zone,":");
    String::FormatIntWidth2_abi_cxx11_(&local_60,(String *)(ulong)(uint)local_218._0_4_,value_03);
    std::operator+(__return_storage_ptr__,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&time_struct.tm_zone);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_238);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  struct tm time_struct;
  if (!PortableLocaltime(static_cast<time_t>(ms / 1000), &time_struct))
    return "";
  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct.tm_mday) + "T" +
      String::FormatIntWidth2(time_struct.tm_hour) + ":" +
      String::FormatIntWidth2(time_struct.tm_min) + ":" +
      String::FormatIntWidth2(time_struct.tm_sec);
}